

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O1

int remux_tiles(CommonTileParams *tiles,uint8_t *dst,uint32_t data_size,uint32_t max_tile_size,
               uint32_t max_tile_col_size,int *tile_size_bytes,int *tile_col_size_bytes)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  int iVar6;
  ulong uVar7;
  uint uVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  if (tiles->large_scale == 0) {
    iVar6 = 4;
    if (max_tile_size < 0x1000000) {
      iVar14 = 3;
      if (max_tile_size < 0x10000) {
        iVar14 = 2 - (uint)(max_tile_size < 0x100);
      }
    }
    else {
      iVar14 = 4;
    }
  }
  else {
    if ((int)max_tile_size < 0) {
      iVar14 = -1;
    }
    else {
      iVar14 = 4;
      if ((max_tile_size < 0x800000) && (iVar14 = 3, max_tile_size < 0x8000)) {
        iVar14 = 2 - (uint)(max_tile_size < 0x80);
      }
    }
    iVar6 = 4;
    if ((max_tile_col_size < 0x1000000) && (iVar6 = 3, max_tile_col_size < 0x10000)) {
      iVar6 = 2 - (uint)(max_tile_col_size < 0x100);
    }
  }
  *tile_size_bytes = iVar14;
  *tile_col_size_bytes = iVar6;
  if (iVar6 != 4 || iVar14 != 4) {
    iVar13 = tiles->cols;
    if (tiles->large_scale == 0) {
      iVar13 = iVar13 * tiles->rows;
      if (0 < iVar13) {
        uVar17 = 0;
        uVar16 = 0;
        do {
          if (iVar13 == 1) {
            iVar6 = data_size - uVar17;
          }
          else {
            uVar7 = (ulong)uVar17;
            uVar8 = (ulong)uVar17;
            uVar9 = (ulong)uVar17;
            uVar10 = (ulong)uVar17;
            if (iVar14 - 1U < 4) {
              iVar6 = (*(code *)(&DAT_004dbed0 + *(int *)(&DAT_004dbed0 + (ulong)(iVar14 - 1U) * 4))
                      )(uVar16);
              return iVar6;
            }
            uVar17 = uVar17 + 4;
            iVar6 = ((uint)dst[uVar9 + 1] << 8 |
                     (uint)dst[uVar8 + 2] << 0x10 | (uint)dst[uVar7 + 3] << 0x18 | (uint)dst[uVar10]
                    ) + 1;
            uVar16 = (ulong)(uint)((int)uVar16 + iVar14);
          }
          memmove(dst + uVar16,dst + uVar17,(long)iVar6);
          uVar17 = uVar17 + iVar6;
          uVar11 = iVar6 + (int)uVar16;
          uVar16 = (ulong)uVar11;
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
        return uVar11;
      }
    }
    else if (0 < iVar13) {
      bVar5 = (char)iVar14 * -8 + 0x20;
      iVar12 = 0;
      if (3 < iVar14) {
        bVar5 = 0;
      }
      uVar16 = 0;
      uVar17 = 0;
      do {
        if (iVar12 < iVar13 + -1) {
          dst[uVar17] = (char)tiles->rows * ((char)iVar14 + -4) +
                        (char)*(undefined4 *)(dst + uVar16);
          iVar6 = (*(code *)(&DAT_004dbea0 + *(int *)(&DAT_004dbea0 + (ulong)(iVar6 - 1) * 4)))
                            (tiles,1,dst + uVar17,8,
                             &DAT_004dbea0 + *(int *)(&DAT_004dbea0 + (ulong)(iVar6 - 1) * 4));
          return iVar6;
        }
        if (0 < tiles->rows) {
          iVar13 = 0;
          do {
            bVar1 = dst[uVar16 + 3];
            bVar2 = dst[uVar16 + 2];
            bVar3 = dst[uVar16 + 1];
            bVar4 = dst[uVar16];
            uVar11 = (uint)bVar3 << 8 | (uint)bVar2 << 0x10 | (uint)bVar4 | (uint)bVar1 << 0x18;
            uVar15 = (int)uVar16 + 4;
            uVar16 = (ulong)uVar15;
            if ((int)((uint)bVar1 << 0x18) < 0) {
              uVar11 = uVar11 >> (bVar5 & 0x1f);
              switch(iVar14) {
              case 1:
                dst[uVar17] = (uint8_t)uVar11;
                break;
              case 2:
                *(short *)(dst + uVar17) = (short)uVar11;
                break;
              case 3:
                dst[uVar17] = (uint8_t)uVar11;
                dst[(ulong)uVar17 + 1] = (uint8_t)(uVar11 >> 8);
                dst[(ulong)uVar17 + 2] = (uint8_t)(uVar11 >> 0x10);
                break;
              case 4:
                *(uint *)(dst + uVar17) = uVar11;
              }
              uVar17 = uVar17 + iVar14;
            }
            else {
              switch(iVar14) {
              case 1:
                dst[uVar17] = bVar4;
                break;
              case 2:
                dst[uVar17] = bVar4;
                dst[(ulong)uVar17 + 1] = bVar3;
                break;
              case 3:
                dst[uVar17] = bVar4;
                dst[(ulong)uVar17 + 1] = bVar3;
                dst[(ulong)uVar17 + 2] = bVar2;
                break;
              case 4:
                dst[uVar17] = bVar4;
                dst[(ulong)uVar17 + 1] = bVar3;
                dst[(ulong)uVar17 + 2] = bVar2;
                dst[(ulong)uVar17 + 3] = bVar1;
              }
              memmove(dst + (uVar17 + iVar14),dst + uVar16,(ulong)(uVar11 + 1));
              uVar16 = (ulong)(uVar15 + uVar11 + 1);
              uVar17 = uVar17 + iVar14 + uVar11 + 1;
            }
            iVar13 = iVar13 + 1;
          } while (iVar13 < tiles->rows);
        }
        iVar12 = iVar12 + 1;
        iVar13 = tiles->cols;
      } while (iVar12 < iVar13);
      return uVar17;
    }
    data_size = 0;
  }
  return data_size;
}

Assistant:

static int remux_tiles(const CommonTileParams *const tiles, uint8_t *dst,
                       const uint32_t data_size, const uint32_t max_tile_size,
                       const uint32_t max_tile_col_size,
                       int *const tile_size_bytes,
                       int *const tile_col_size_bytes) {
  // Choose the tile size bytes (tsb) and tile column size bytes (tcsb)
  int tsb;
  int tcsb;

  if (tiles->large_scale) {
    // The top bit in the tile size field indicates tile copy mode, so we
    // have 1 less bit to code the tile size
    tsb = choose_size_bytes(max_tile_size, 1);
    tcsb = choose_size_bytes(max_tile_col_size, 0);
  } else {
    tsb = choose_size_bytes(max_tile_size, 0);
    tcsb = 4;  // This is ignored
    (void)max_tile_col_size;
  }

  assert(tsb > 0);
  assert(tcsb > 0);

  *tile_size_bytes = tsb;
  *tile_col_size_bytes = tcsb;
  if (tsb == 4 && tcsb == 4) return data_size;

  uint32_t wpos = 0;
  uint32_t rpos = 0;

  if (tiles->large_scale) {
    int tile_row;
    int tile_col;

    for (tile_col = 0; tile_col < tiles->cols; tile_col++) {
      // All but the last column has a column header
      if (tile_col < tiles->cols - 1) {
        uint32_t tile_col_size = mem_get_le32(dst + rpos);
        rpos += 4;

        // Adjust the tile column size by the number of bytes removed
        // from the tile size fields.
        tile_col_size -= (4 - tsb) * tiles->rows;

        mem_put_varsize(dst + wpos, tcsb, tile_col_size);
        wpos += tcsb;
      }

      for (tile_row = 0; tile_row < tiles->rows; tile_row++) {
        // All, including the last row has a header
        uint32_t tile_header = mem_get_le32(dst + rpos);
        rpos += 4;

        // If this is a copy tile, we need to shift the MSB to the
        // top bit of the new width, and there is no data to copy.
        if (tile_header >> 31 != 0) {
          if (tsb < 4) tile_header >>= 32 - 8 * tsb;
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;
        } else {
          mem_put_varsize(dst + wpos, tsb, tile_header);
          wpos += tsb;

          tile_header += AV1_MIN_TILE_SIZE_BYTES;
          memmove(dst + wpos, dst + rpos, tile_header);
          rpos += tile_header;
          wpos += tile_header;
        }
      }
    }

    assert(rpos > wpos);
    assert(rpos == data_size);

    return wpos;
  }
  const int n_tiles = tiles->cols * tiles->rows;
  int n;

  for (n = 0; n < n_tiles; n++) {
    int tile_size;

    if (n == n_tiles - 1) {
      tile_size = data_size - rpos;
    } else {
      tile_size = mem_get_le32(dst + rpos);
      rpos += 4;
      mem_put_varsize(dst + wpos, tsb, tile_size);
      tile_size += AV1_MIN_TILE_SIZE_BYTES;
      wpos += tsb;
    }

    memmove(dst + wpos, dst + rpos, tile_size);

    rpos += tile_size;
    wpos += tile_size;
  }

  assert(rpos > wpos);
  assert(rpos == data_size);

  return wpos;
}